

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

bool __thiscall Js::DebuggerScope::IsBlockScope(DebuggerScope *this)

{
  code *pcVar1;
  bool bVar2;
  Type TVar3;
  undefined4 *puVar4;
  
  TVar3 = this->scopeType;
  if (TVar3 == DiagBlockScopeRangeEnd) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1761,"(this->scopeType != Js::DiagBlockScopeRangeEnd)",
                                "Debugger scope type should never be set to range end - only reserved for marking the end of a scope (not persisted)."
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    TVar3 = this->scopeType;
  }
  return TVar3 - DiagBlockScopeDirect < 4;
}

Assistant:

bool DebuggerScope::IsBlockScope() const
    {
        AssertMsg(this->scopeType != Js::DiagBlockScopeRangeEnd, "Debugger scope type should never be set to range end - only reserved for marking the end of a scope (not persisted).");
        return this->scopeType == Js::DiagBlockScopeDirect
            || this->scopeType == Js::DiagBlockScopeInObject
            || this->scopeType == Js::DiagBlockScopeInSlot
            || this->scopeType == Js::DiagBlockScopeRangeEnd;
    }